

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_ustar(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  wchar_t wVar1;
  wchar_t wVar2;
  dev_t dVar3;
  archive_string *in_RCX;
  archive_entry *in_RDX;
  archive_entry *in_RSI;
  tar *in_RDI;
  wchar_t r;
  wchar_t err;
  archive_string *as;
  archive_entry_header_ustar *header;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  archive_string *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  archive_entry *entry_00;
  uint in_stack_ffffffffffffffc0;
  wchar_t wVar4;
  archive_read *a_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  wVar4 = L'\0';
  a_00 = (archive_read *)&in_RSI->ae_stat;
  if (*(char *)((long)&in_RCX[0xe].length + 1) == '\0') {
    *(undefined8 *)&(in_RSI->ae_stat).aest_atime_nsec = 0;
    archive_strncat(in_RCX,a_00,(ulong)in_stack_ffffffffffffffc0);
  }
  else {
    *(undefined8 *)&(in_RSI->ae_stat).aest_atime_nsec = 0;
    archive_strncat(in_RCX,a_00,(ulong)in_stack_ffffffffffffffc0);
    if (*(char *)((long)(a_00->archive).vtable + *(long *)&a_00->archive + -1) != '/') {
      archive_strappend_char(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
    }
    archive_strncat(in_RCX,a_00,CONCAT44(wVar4,in_stack_ffffffffffffffc0));
  }
  wVar1 = _archive_entry_copy_pathname_l
                    ((archive_entry *)CONCAT44(wVar4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0,
                     (archive_string_conv *)
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if (((wVar1 == L'\0') ||
      (wVar4 = set_conversion_failed_error
                         (a_00,(archive_string_conv *)CONCAT44(wVar4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8), wVar1 = wVar4, wVar4 != L'\xffffffe2')) &&
     (wVar2 = header_common((archive_read *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            in_RSI,in_RDX), wVar1 = wVar2, wVar2 != L'\xffffffe2')) {
    if (wVar2 < wVar4) {
      wVar4 = wVar2;
    }
    wVar1 = _archive_entry_copy_uname_l
                      ((archive_entry *)CONCAT44(wVar4,wVar2),in_stack_ffffffffffffffb8,
                       (size_t)in_stack_ffffffffffffffb0,
                       (archive_string_conv *)
                       CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    if (((wVar1 == L'\0') ||
        (wVar4 = set_conversion_failed_error
                           (a_00,(archive_string_conv *)CONCAT44(wVar4,wVar2),
                            in_stack_ffffffffffffffb8), wVar1 = wVar4, wVar4 != L'\xffffffe2')) &&
       ((wVar1 = _archive_entry_copy_gname_l
                           ((archive_entry *)CONCAT44(wVar4,wVar2),in_stack_ffffffffffffffb8,
                            (size_t)in_stack_ffffffffffffffb0,
                            (archive_string_conv *)
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)),
        wVar1 == L'\0' ||
        (wVar4 = set_conversion_failed_error
                           (a_00,(archive_string_conv *)CONCAT44(wVar4,wVar2),
                            in_stack_ffffffffffffffb8), wVar1 = wVar4, wVar4 != L'\xffffffe2')))) {
      if ((*(char *)((long)&in_RCX[6].length + 4) == '3') ||
         (*(char *)((long)&in_RCX[6].length + 4) == '4')) {
        entry_00 = in_RDX;
        dVar3 = tar_atol((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                         0x155110);
        archive_entry_set_rdevmajor(in_RDX,dVar3);
        dVar3 = tar_atol((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                         0x15513d);
        archive_entry_set_rdevminor(entry_00,dVar3);
      }
      (in_RSI->ae_fflags_text).aes_mbs_in_locale.buffer_length =
           -(long)(in_RSI->ae_fflags_text).aes_mbs_in_locale.s & 0x1ff;
      wVar1 = wVar4;
    }
  }
  return wVar1;
}

Assistant:

static int
header_ustar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	struct archive_string *as;
	int err = ARCHIVE_OK, r;

	header = (const struct archive_entry_header_ustar *)h;

	/* Copy name into an internal buffer to ensure null-termination. */
	as = &(tar->entry_pathname);
	if (header->prefix[0]) {
		archive_strncpy(as, header->prefix, sizeof(header->prefix));
		if (as->s[archive_strlen(as) - 1] != '/')
			archive_strappend_char(as, '/');
		archive_strncat(as, header->name, sizeof(header->name));
	} else {
		archive_strncpy(as, header->name, sizeof(header->name));
	}
	if (archive_entry_copy_pathname_l(entry, as->s, archive_strlen(as),
	    tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Handle rest of common fields. */
	r = header_common(a, tar, entry, h);
	if (r == ARCHIVE_FATAL)
		return (r);
	if (r < err)
		err = r;

	/* Handle POSIX ustar fields. */
	if (archive_entry_copy_uname_l(entry,
	    header->uname, sizeof(header->uname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Uname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	if (archive_entry_copy_gname_l(entry,
	    header->gname, sizeof(header->gname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Gname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Parse out device numbers only for char and block specials. */
	if (header->typeflag[0] == '3' || header->typeflag[0] == '4') {
		archive_entry_set_rdevmajor(entry, (dev_t)
		    tar_atol(header->rdevmajor, sizeof(header->rdevmajor)));
		archive_entry_set_rdevminor(entry, (dev_t)
		    tar_atol(header->rdevminor, sizeof(header->rdevminor)));
	}

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);

	return (err);
}